

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
cmLocalGenerator::GetShouldUseOldFlags(cmLocalGenerator *this,bool shared,string *lang)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  string *psVar4;
  ostream *poVar5;
  PolicyID id;
  byte bVar6;
  undefined7 in_register_00000031;
  string flagsVar;
  string originalFlags;
  ostringstream e;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [376];
  
  cmGlobalGenerator::GetSharedLibFlagsForLanguage(&local_1b8,this->GlobalGenerator,lang);
  if ((int)CONCAT71(in_register_00000031,shared) != 0) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_SHARED_LIBRARY_","")
    ;
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_1f8);
    psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,&local_1f8);
    __n = psVar4->_M_string_length;
    if (__n == local_1b8._M_string_length) {
      if (__n != 0) {
        iVar2 = bcmp((psVar4->_M_dataplus)._M_p,local_1b8._M_dataplus._M_p,__n);
        if (iVar2 != 0) goto LAB_0021ccd7;
      }
LAB_0021ce43:
      bVar6 = shared;
      bVar1 = true;
    }
    else {
LAB_0021ccd7:
      PVar3 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0018,false);
      if (PVar3 - NEW < 3) {
        bVar6 = 0;
      }
      else {
        bVar6 = 1;
        if (PVar3 != OLD) {
          shared = (bool)1;
          if (PVar3 != WARN) goto LAB_0021ce43;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Variable ",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_198,local_1f8._M_dataplus._M_p,
                              local_1f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     " has been modified. CMake will ignore the POSITION_INDEPENDENT_CODE target property for shared libraries and will use the "
                     ,0x7a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," variable instead.  This may cause errors if the original content of ",
                     0x45);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," was removed.\n",0xe);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x12,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1d8,
                              &this->DirectoryBacktrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
          std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
        }
      }
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_0021ce61;
  }
  bVar6 = 0;
LAB_0021ce61:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmLocalGenerator::GetShouldUseOldFlags(bool shared,
                                            const std::string& lang) const
{
  std::string originalFlags =
    this->GlobalGenerator->GetSharedLibFlagsForLanguage(lang);
  if (shared) {
    std::string flagsVar = "CMAKE_SHARED_LIBRARY_";
    flagsVar += lang;
    flagsVar += "_FLAGS";
    std::string const& flags = this->Makefile->GetSafeDefinition(flagsVar);

    if (flags != originalFlags) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0018)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << "Variable " << flagsVar
            << " has been modified. CMake "
               "will ignore the POSITION_INDEPENDENT_CODE target property for "
               "shared libraries and will use the "
            << flagsVar
            << " variable "
               "instead.  This may cause errors if the original content of "
            << flagsVar << " was removed.\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0018);

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          return true;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          return false;
      }
    }
  }
  return false;
}